

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameracollection.cc
# Opt level: O3

void __thiscall gvr::CameraCollection::loadCamera(CameraCollection *this,char *file)

{
  int iVar1;
  long lVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  double t;
  double dmin;
  double doffs;
  Properties prop_1;
  double dmax;
  Properties mprop;
  string s;
  string name;
  PinholeCamera cam;
  Matrix33d A;
  Properties prop;
  double local_370;
  double local_368;
  double local_360;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_358;
  double local_328;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  undefined1 *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  code *local_290;
  string local_288 [8];
  undefined1 local_280 [256];
  long *local_180;
  SMatrix<double,_3,_3> local_178;
  undefined1 local_130 [8];
  double local_128;
  _Base_ptr ap_Stack_120 [32];
  long *local_20;
  
  std::__cxx11::string::string((string *)local_2d0,file,(allocator *)&local_290);
  lVar2 = std::__cxx11::string::find_last_of((char *)local_2d0,0x127b5c,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_290,(ulong)local_2d0);
    std::__cxx11::string::operator=((string *)local_2d0,(string *)&local_290);
    if (local_290 != (code *)local_280) {
      operator_delete(local_290);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)local_2d0);
  if (iVar1 == 0) {
    gutil::Properties::Properties((Properties *)&local_320,file);
    local_358._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_358._M_impl.super__Rb_tree_header._M_header;
    local_358._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_358._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_358._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_178.v[1][0] = 0.0;
    local_178.v[2][1] = 0.0;
    local_178.v[1][2] = 0.0;
    local_178.v[2][0] = 0.0;
    local_178.v[0][1] = 0.0;
    local_178.v[0][2] = 0.0;
    local_178.v[0][0] = 1.0;
    local_178.v[1][1] = 1.0;
    local_178.v[2][2] = 1.0;
    local_358._M_impl.super__Rb_tree_header._M_header._M_right =
         local_358._M_impl.super__Rb_tree_header._M_header._M_left;
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_320,"cam0",&local_178,(char *)0x0);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_358,"camera.A",&local_178);
    local_2e8 = 0;
    local_2e0[0] = 0;
    local_2f0 = local_2e0;
    gutil::Properties::getString((char *)&local_320,(string *)0x127ca5,(char *)&local_2f0);
    gutil::Properties::putString((char *)&local_358,(string *)"camera.width");
    gutil::Properties::getString((char *)&local_320,(string *)0x127cb2,(char *)&local_2f0);
    gutil::Properties::putString((char *)&local_358,(string *)"camera.height");
    gutil::Properties::putValue<double>((Properties *)&local_358,"f",(double *)&local_178);
    gutil::Properties::getValue<double>((Properties *)&local_320,"baseline",&local_370,(char *)0x0);
    gutil::Properties::putValue<double>((Properties *)&local_358,"t",&local_370);
    local_290 = (code *)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[1 0 0; 0 1 0; 0 0 1]","")
    ;
    gutil::Properties::putString((char *)&local_358,(string *)"camera.R");
    if (local_290 != (code *)local_280) {
      operator_delete(local_290);
    }
    gutil::Properties::putValue<char[8]>
              ((Properties *)&local_358,"camera.T",(char (*) [8])"[0 0 0]");
    gutil::Properties::getValue<double>((Properties *)&local_320,"doffs",&local_360,"0");
    gutil::Properties::getValue<double>((Properties *)&local_320,"vmin",&local_368,"0");
    gutil::Properties::getValue<double>((Properties *)&local_320,"vmax",&local_328,"0");
    if ((0.0 < local_368) && (0.0 < local_328)) {
      local_290 = (code *)((local_178.v[0][0] * local_370) / (local_328 + local_360));
      gutil::Properties::putValue<double>
                ((Properties *)&local_358,"camera.zmin",(double *)&local_290);
      local_290 = (code *)((local_178.v[0][0] * local_370) / (local_368 + local_360));
      gutil::Properties::putValue<double>
                ((Properties *)&local_358,"camera.zmax",(double *)&local_290);
    }
    local_290 = (code *)local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"cam0, cam1","");
    gutil::Properties::putString((char *)&local_358,(string *)"camera.match");
    if (local_290 != (code *)local_280) {
      operator_delete(local_290);
    }
    gmath::PinholeCamera::PinholeCamera((PinholeCamera *)&local_290,(Properties *)&local_358,-1);
    local_130 = (undefined1  [8])ap_Stack_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"cam0","");
    std::__cxx11::string::_M_assign(local_288);
    if (local_130 != (undefined1  [8])ap_Stack_120) {
      operator_delete((void *)local_130);
    }
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,(value_type *)&local_290);
    gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_320,"cam1",&local_178,(char *)0x0);
    gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
              ((Properties *)&local_358,"camera.A",&local_178);
    local_130 = (undefined1  [8])local_370;
    local_128 = 0.0;
    ap_Stack_120[0] = (_Base_ptr)0x0;
    gutil::Properties::putValue<gmath::SVector<double,3>>
              ((Properties *)&local_358,"camera.T",(SVector<double,_3> *)local_130);
    gmath::PinholeCamera::PinholeCamera((PinholeCamera *)local_130,(Properties *)&local_358,-1);
    local_2b0[0] = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"cam1","");
    std::__cxx11::string::_M_assign((string *)&local_128);
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0]);
    }
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,(value_type *)local_130);
    local_130 = (undefined1  [8])gutil::Properties::load;
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
    gmath::Camera::~Camera((Camera *)local_130);
    local_290 = gutil::Properties::load;
    if (local_180 != (long *)0x0) {
      (**(code **)(*local_180 + 8))();
    }
    gmath::Camera::~Camera((Camera *)&local_290);
    if (local_2f0 != local_2e0) {
      operator_delete(local_2f0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_358);
    this_00 = &local_320;
  }
  else {
    gutil::Properties::Properties((Properties *)local_130,file);
    gmath::PinholeCamera::PinholeCamera((PinholeCamera *)&local_290,(Properties *)local_130,-1);
    std::__cxx11::string::_M_assign(local_288);
    std::vector<gmath::PinholeCamera,_std::allocator<gmath::PinholeCamera>_>::push_back
              (&this->cl,(value_type *)&local_290);
    local_290 = gutil::Properties::load;
    if (local_180 != (long *)0x0) {
      (**(code **)(*local_180 + 8))();
    }
    gmath::Camera::~Camera((Camera *)&local_290);
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_130;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_00);
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0]);
  }
  return;
}

Assistant:

void CameraCollection::loadCamera(const char *file)
{
  std::string name=file;

  size_t i=name.find_last_of("/\\");

  if (i != name.npos)
  {
    name=name.substr(i+1);
  }

  if (name == "calib.txt")
  {
    // conversion of pinhole camera parameters from Middlebury format

    gutil::Properties mprop(file), prop;

    gmath::Matrix33d A;
    mprop.getValue("cam0", A);
    prop.putValue("camera.A", A);

    std::string s;
    mprop.getString("width", s, "0");
    prop.putString("camera.width", s);
    mprop.getString("height", s, "0");
    prop.putString("camera.height", s);

    prop.putValue("f", A(0, 0));

    double t;
    mprop.getValue("baseline", t);
    prop.putValue("t", t);

    prop.putString("camera.R", "[1 0 0; 0 1 0; 0 0 1]");
    prop.putValue("camera.T", "[0 0 0]");

    double doffs, dmin, dmax;

    mprop.getValue("doffs", doffs, "0");
    mprop.getValue("vmin", dmin, "0");
    mprop.getValue("vmax", dmax, "0");

    if (dmin > 0 && dmax > 0)
    {
      prop.putValue("camera.zmin", A(0, 0)*t/(dmax+doffs));
      prop.putValue("camera.zmax", A(0, 0)*t/(dmin+doffs));
    }

    prop.putString("camera.match", "cam0, cam1");

    gmath::PinholeCamera cam0(prop);
    cam0.setName("cam0");
    cl.push_back(cam0);

    mprop.getValue("cam1", A);
    prop.putValue("camera.A", A);
    prop.putValue("camera.T", gmath::Vector3d(t, 0, 0));

    gmath::PinholeCamera cam1(prop);
    cam1.setName("cam1");
    cl.push_back(cam1);
  }
  else
  {
    // load text file as pinhole camera and store in list

    gutil::Properties prop(file);
    gmath::PinholeCamera cam(prop);
    cam.setName(name);

    // add camera model

    cl.push_back(cam);
  }
}